

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O3

bool __thiscall
OpenCLEnum::queryExtensionList
          (OpenCLEnum *this,cl_device_id device_id,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  pointer pDVar1;
  bool bVar2;
  OpenCLEnum *this_00;
  pointer __v;
  _Alloc_node __an;
  string extensions_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this_00 = (OpenCLEnum *)local_88;
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (pointer)0x0;
  local_68[0x10] = '\0';
  pDVar1 = (pointer)(local_88 + 0x10);
  local_88._0_8_ = pDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CL_DEVICE_EXTENSIONS","");
  bVar2 = queryDeviceInfo(this_00,device_id,0x1030,(string *)local_68,(string *)local_88,0);
  if ((pointer)local_88._0_8_ != pDVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  if (bVar2) {
    local_88._0_8_ = pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88," ","");
    split(&local_48,(string *)local_68,(string *)local_88,true);
    if ((pointer)local_88._0_8_ != pDVar1) {
      operator_delete((void *)local_88._0_8_);
    }
    local_88._0_8_ = extensions;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)extensions,(const_iterator)&(extensions->_M_t)._M_impl.super__Rb_tree_header,
                   __v,(_Alloc_node *)local_88);
        __v = __v + 1;
      } while (__v != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  return bVar2;
}

Assistant:

bool OpenCLEnum::queryExtensionList(cl_device_id device_id, std::set<std::string> &extensions)
{
	std::string extensions_string;
	if (!queryDeviceInfo(device_id, CL_DEVICE_EXTENSIONS, extensions_string, "CL_DEVICE_EXTENSIONS"))
		return false;

	std::vector<std::string> tokens = split(extensions_string, " ");
	extensions.insert(tokens.begin(), tokens.end());
	return true;
}